

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall cs::instance_type::compile(instance_type *this,istream *in)

{
  undefined1 uVar1;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ast;
  deque<char,_std::allocator<char>_> buff;
  
  std::_Deque_base<char,_std::allocator<char>_>::_Deque_base
            (&buff.super__Deque_base<char,_std::allocator<char>_>);
  uVar1 = std::istream::get();
  while (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    ast.
    super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map._0_1_ = uVar1;
    std::deque<char,_std::allocator<char>_>::emplace_back<char>(&buff,(char *)&ast);
    uVar1 = std::istream::get();
  }
  std::
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::_Deque_base(&ast.
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               );
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::clear
            (&((((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->constant_pool);
  compiler_type::build_ast
            ((((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&buff,&ast,utf8);
  compiler_type::code_gen
            ((((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&ast,&this->statements);
  compiler_type::utilize_metadata
            ((((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque(&ast);
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            (&buff.super__Deque_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void instance_type::compile(std::istream &in)
	{
		// Read from file
		std::deque<char> buff;
		for (int ch = in.get(); in; ch = in.get())
			buff.push_back(ch);
		std::deque<std::deque<token_base *>> ast;
		// Compile
		context->compiler->clear_metadata();
		context->compiler->build_ast(buff, ast);
		context->compiler->code_gen(ast, statements);
		context->compiler->utilize_metadata();
	}